

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O1

xmlCatalogEntryPtr
xmlParseXMLCatalogOneNode
          (xmlNodePtr cur,xmlCatalogEntryType type,xmlChar *name,xmlChar *attrName,
          xmlChar *uriAttrName,xmlCatalogPrefer prefer,xmlCatalogEntryPtr cgroup)

{
  xmlGenericErrorFunc p_Var1;
  bool bVar2;
  bool bVar3;
  xmlChar *name_00;
  xmlChar *URI;
  xmlChar *base;
  xmlChar *URL;
  xmlGenericErrorFunc *pp_Var4;
  void **ppvVar5;
  xmlCatalogEntryPtr pxVar6;
  
  bVar2 = true;
  bVar3 = true;
  if (attrName != (xmlChar *)0x0) {
    name_00 = xmlGetProp(cur,attrName);
    if (name_00 != (xmlChar *)0x0) goto LAB_0013d905;
    __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,cur
                    ,0x14,0x672,XML_ERR_ERROR,(char *)0x0,0,(char *)name,(char *)attrName,
                    (char *)0x0,0,0,"%s entry lacks \'%s\'\n",name,attrName,0);
    bVar3 = false;
  }
  bVar2 = bVar3;
  name_00 = (xmlChar *)0x0;
LAB_0013d905:
  URI = xmlGetProp(cur,uriAttrName);
  if (URI == (xmlChar *)0x0) {
    bVar2 = false;
    __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,cur
                    ,0x14,0x672,XML_ERR_ERROR,(char *)0x0,0,(char *)name,(char *)uriAttrName,
                    (char *)0x0,0,0,"%s entry lacks \'%s\'\n",name,uriAttrName,0);
  }
  if (bVar2) {
    base = xmlNodeGetBase(cur->doc,cur);
    URL = xmlBuildURI(URI,base);
    if (URL == (xmlChar *)0x0) {
      pxVar6 = (xmlCatalogEntryPtr)0x0;
      __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                      cur,0x14,0x673,XML_ERR_ERROR,(char *)0x0,0,(char *)name,(char *)uriAttrName,
                      (char *)URI,0,0,"%s entry \'%s\' broken ?: %s\n",name,uriAttrName,URI);
    }
    else {
      if (1 < xmlDebugCatalogs) {
        pp_Var4 = __xmlGenericError();
        p_Var1 = *pp_Var4;
        ppvVar5 = __xmlGenericErrorContext();
        if (name_00 == (xmlChar *)0x0) {
          (*p_Var1)(*ppvVar5,"Found %s: \'%s\'\n",name,URL);
        }
        else {
          (*p_Var1)(*ppvVar5,"Found %s: \'%s\' \'%s\'\n",name,name_00,URL);
        }
      }
      pxVar6 = xmlNewCatalogEntry(type,name_00,URI,URL,prefer,cgroup);
    }
    if (name_00 != (xmlChar *)0x0) {
      (*xmlFree)(name_00);
    }
    if (URI != (xmlChar *)0x0) {
      (*xmlFree)(URI);
    }
    if (base != (xmlChar *)0x0) {
      (*xmlFree)(base);
    }
  }
  else {
    if (name_00 != (xmlChar *)0x0) {
      (*xmlFree)(name_00);
    }
    pxVar6 = (xmlCatalogEntryPtr)0x0;
    URL = URI;
  }
  if (URL != (xmlChar *)0x0) {
    (*xmlFree)(URL);
  }
  return pxVar6;
}

Assistant:

static xmlCatalogEntryPtr
xmlParseXMLCatalogOneNode(xmlNodePtr cur, xmlCatalogEntryType type,
			  const xmlChar *name, const xmlChar *attrName,
			  const xmlChar *uriAttrName, xmlCatalogPrefer prefer,
			  xmlCatalogEntryPtr cgroup) {
    int ok = 1;
    xmlChar *uriValue;
    xmlChar *nameValue = NULL;
    xmlChar *base = NULL;
    xmlChar *URL = NULL;
    xmlCatalogEntryPtr ret = NULL;

    if (attrName != NULL) {
	nameValue = xmlGetProp(cur, attrName);
	if (nameValue == NULL) {
	    xmlCatalogErr(ret, cur, XML_CATALOG_MISSING_ATTR,
			  "%s entry lacks '%s'\n", name, attrName, NULL);
	    ok = 0;
	}
    }
    uriValue = xmlGetProp(cur, uriAttrName);
    if (uriValue == NULL) {
	xmlCatalogErr(ret, cur, XML_CATALOG_MISSING_ATTR,
		"%s entry lacks '%s'\n", name, uriAttrName, NULL);
	ok = 0;
    }
    if (!ok) {
	if (nameValue != NULL)
	    xmlFree(nameValue);
	if (uriValue != NULL)
	    xmlFree(uriValue);
	return(NULL);
    }

    base = xmlNodeGetBase(cur->doc, cur);
    URL = xmlBuildURI(uriValue, base);
    if (URL != NULL) {
	if (xmlDebugCatalogs > 1) {
	    if (nameValue != NULL)
		xmlGenericError(xmlGenericErrorContext,
			"Found %s: '%s' '%s'\n", name, nameValue, URL);
	    else
		xmlGenericError(xmlGenericErrorContext,
			"Found %s: '%s'\n", name, URL);
	}
	ret = xmlNewCatalogEntry(type, nameValue, uriValue, URL, prefer, cgroup);
    } else {
	xmlCatalogErr(ret, cur, XML_CATALOG_ENTRY_BROKEN,
		"%s entry '%s' broken ?: %s\n", name, uriAttrName, uriValue);
    }
    if (nameValue != NULL)
	xmlFree(nameValue);
    if (uriValue != NULL)
	xmlFree(uriValue);
    if (base != NULL)
	xmlFree(base);
    if (URL != NULL)
	xmlFree(URL);
    return(ret);
}